

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

void __thiscall
cs_impl::any::holder<cs::type_t>::holder<std::function<cs_impl::any()>const&,std::type_index_const&>
          (holder<cs::type_t> *this,function<cs_impl::any_()> *args,type_index *args_1)

{
  type_info *ptVar1;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type p_Stack_20;
  
  (this->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__holder_00250c28;
  std::function<cs_impl::any_()>::function((function<cs_impl::any_()> *)&local_38,args);
  ptVar1 = args_1->_M_target;
  *(undefined8 *)&(this->mDat).constructor.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->mDat).constructor.super__Function_base._M_functor + 8) = 0;
  (this->mDat).constructor.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mDat).constructor._M_invoker = p_Stack_20;
  if (local_28 != (_Manager_type)0x0) {
    *(void **)&(this->mDat).constructor.super__Function_base._M_functor =
         local_38._M_unused._M_object;
    *(undefined8 *)((long)&(this->mDat).constructor.super__Function_base._M_functor + 8) =
         local_38._8_8_;
    (this->mDat).constructor.super__Function_base._M_manager = local_28;
    local_28 = (_Manager_type)0x0;
    p_Stack_20 = (_Invoker_type)0x0;
  }
  (this->mDat).extensions.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->mDat).extensions.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mDat).id.type_idx._M_target = ptVar1;
  (this->mDat).id.type_hash = 0;
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}